

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.cpp
# Opt level: O0

void rpn_NOT(Expression *expr,Expression *src)

{
  bool bVar1;
  uint8_t *puVar2;
  Expression *src_local;
  Expression *expr_local;
  
  memcpy(expr,src,0x30);
  expr->isSymbol = false;
  bVar1 = rpn_isKnown(expr);
  if (bVar1) {
    expr->val = expr->val ^ 0xffffffff;
  }
  else {
    expr->rpnPatchSize = expr->rpnPatchSize + 1;
    puVar2 = reserveSpace(expr,1);
    *puVar2 = '\x13';
  }
  return;
}

Assistant:

void rpn_NOT(struct Expression *expr, const struct Expression *src)
{
	*expr = *src;
	expr->isSymbol = false;

	if (rpn_isKnown(expr)) {
		expr->val = ~expr->val;
	} else {
		expr->rpnPatchSize++;
		*reserveSpace(expr, 1) = RPN_NOT;
	}
}